

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O2

void anon_unknown.dwarf_36ee15::handle_begin
               (Attribute *attr,Variant *value,int prop,Blackboard *blackboard,MetadataTree *tree)

{
  cali_id_t key;
  Entry local_60;
  Entry local_48;
  
  if ((prop & 1U) == 0) {
    key = (ulong)(((uint)prop >> 10 & 1) != 0) + 1;
    cali::Blackboard::get(&local_60,blackboard,key);
    local_48.m_node = cali::internal::MetadataTree::get_child(tree,attr,value,local_60.m_node);
    local_48.m_value.m_v.type_and_size = ((local_48.m_node)->m_data).m_v.type_and_size;
    local_48.m_value.m_v.value = ((local_48.m_node)->m_data).m_v.value;
  }
  else {
    local_48.m_node = attr->m_node;
    if (local_48.m_node == (Node *)0x0) {
      key = 0xffffffffffffffff;
    }
    else {
      key = (local_48.m_node)->m_id;
    }
    local_48.m_value.m_v.type_and_size = (value->m_v).type_and_size;
    local_48.m_value.m_v.value = (value->m_v).value;
  }
  cali::Blackboard::set(blackboard,key,&local_48,-1 < (char)prop);
  return;
}

Assistant:

inline void handle_begin(
    const Attribute& attr,
    const Variant&   value,
    int              prop,
    Blackboard&      blackboard,
    MetadataTree&    tree
)
{
    if (prop & CALI_ATTR_ASVALUE) {
        blackboard.set(attr.id(), Entry(attr, value), !(prop & CALI_ATTR_HIDDEN));
    } else {
        cali_id_t key   = get_blackboard_key_for_reference_entry(prop);
        Entry     entry = Entry(tree.get_child(attr, value, blackboard.get(key).node()));
        blackboard.set(key, entry, !(prop & CALI_ATTR_HIDDEN));
    }
}